

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz.h
# Opt level: O2

ZZ<130UL> * __thiscall GF2::ZZ<130UL>::operator-=(ZZ<130UL> *this,ZZ<130UL> *zRight)

{
  word *pwVar1;
  ulong uVar2;
  size_t pos;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar2 = 0;
  for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
    uVar5 = (this->super_WW<130UL>)._words[lVar3] - uVar2;
    (this->super_WW<130UL>)._words[lVar3] = uVar5;
    uVar4 = uVar5 - (zRight->super_WW<130UL>)._words[lVar3];
    (this->super_WW<130UL>)._words[lVar3] = uVar4;
    if (!CARRY8(uVar5,uVar2)) {
      uVar2 = (ulong)CARRY8(uVar4,(zRight->super_WW<130UL>)._words[lVar3]);
    }
  }
  pwVar1 = (this->super_WW<130UL>)._words + 2;
  *pwVar1 = *pwVar1 & 3;
  return this;
}

Assistant:

ZZ& operator-=(const ZZ& zRight)
	{	
		word borrow = 0;
		for (size_t pos = 0; pos < _wcount; pos++)
			if ((_words[pos] -= borrow) > WORD_MAX - borrow) 
				_words[pos] -= zRight.GetWord(pos);
            else 
				borrow = (_words[pos] -= zRight.GetWord(pos)) > 
					WORD_MAX - zRight.GetWord(pos);
		Trim();
		return *this;
	}